

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextShutdown(ImGuiContext *ctx)

{
  ImGuiDockNode *p;
  long lVar1;
  long lVar2;
  
  if (0 < (ctx->DockContext).Nodes.Data.Size) {
    lVar1 = 8;
    lVar2 = 0;
    do {
      p = *(ImGuiDockNode **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar1);
      if (p != (ImGuiDockNode *)0x0) {
        IM_DELETE<ImGuiDockNode>(p);
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (lVar2 < (ctx->DockContext).Nodes.Data.Size);
  }
  return;
}

Assistant:

void ImGui::DockContextShutdown(ImGuiContext* ctx)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            IM_DELETE(node);
}